

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O1

void miIntersectO(QRegionPrivate *dest,QRect *r1,QRect *r1End,QRect *r2,QRect *r2End,int y1,int y2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  pointer pQVar5;
  int iVar6;
  QList<QRect> *this;
  
  this = &dest->rects;
  pQVar5 = QList<QRect>::data(this);
  if (r2 != r2End && r1 != r1End) {
    pQVar5 = pQVar5 + dest->numRects;
    do {
      iVar1 = (r1->x1).m_i;
      iVar2 = (r1->x2).m_i;
      iVar3 = (r2->x1).m_i;
      iVar6 = (r2->x2).m_i;
      if (iVar3 < iVar1) {
        iVar3 = iVar1;
      }
      if (iVar2 < iVar6) {
        iVar6 = iVar2;
      }
      if (iVar3 <= iVar6) {
        lVar4 = (dest->rects).d.size;
        if (lVar4 + -1 <= (long)dest->numRects) {
          QList<QRect>::resize(this,lVar4 * 2);
          pQVar5 = QList<QRect>::data(this);
          pQVar5 = pQVar5 + dest->numRects;
        }
        (pQVar5->x1).m_i = iVar3;
        (pQVar5->y1).m_i = y1;
        (pQVar5->x2).m_i = iVar6;
        (pQVar5->y2).m_i = y2;
        dest->numRects = dest->numRects + 1;
        pQVar5 = pQVar5 + 1;
      }
      iVar1 = (r1->x2).m_i;
      iVar2 = (r2->x2).m_i;
      if (iVar1 < iVar2) {
        r1 = r1 + 1;
      }
      else {
        if (iVar1 <= iVar2) {
          r1 = r1 + 1;
        }
        r2 = r2 + 1;
      }
    } while ((r1 != r1End) && (r2 != r2End));
  }
  return;
}

Assistant:

static void miIntersectO(QRegionPrivate &dest, const QRect *r1, const QRect *r1End,
                         const QRect *r2, const QRect *r2End, int y1, int y2)
{
    int x1;
    int x2;
    QRect *pNextRect;

    pNextRect = dest.rects.data() + dest.numRects;

    while (r1 != r1End && r2 != r2End) {
        x1 = qMax(r1->left(), r2->left());
        x2 = qMin(r1->right(), r2->right());

        /*
         * If there's any overlap between the two rectangles, add that
         * overlap to the new region.
         * There's no need to check for subsumption because the only way
         * such a need could arise is if some region has two rectangles
         * right next to each other. Since that should never happen...
         */
        if (x1 <= x2) {
            Q_ASSERT(y1 <= y2);
            MEMCHECK(dest, pNextRect, dest.rects)
            pNextRect->setCoords(x1, y1, x2, y2);
            ++dest.numRects;
            ++pNextRect;
        }

        /*
         * Need to advance the pointers. Shift the one that extends
         * to the right the least, since the other still has a chance to
         * overlap with that region's next rectangle, if you see what I mean.
         */
        if (r1->right() < r2->right()) {
            ++r1;
        } else if (r2->right() < r1->right()) {
            ++r2;
        } else {
            ++r1;
            ++r2;
        }
    }
}